

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O0

void __thiscall DiStefano::FirstScan(DiStefano *this)

{
  int iVar1;
  long lVar2;
  uchar *puVar3;
  uint *puVar4;
  int local_58;
  int k_1;
  int i_class_1;
  int k;
  int i_class;
  int lx;
  int ls;
  int lr;
  int lq;
  int lp;
  int x;
  uint *img_labels_row_prev;
  uint *img_labels_row;
  uchar *img_row;
  int y;
  DiStefano *this_local;
  
  this->i_new_label = 0;
  for (img_row._4_4_ = 0;
      img_row._4_4_ < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
      img_row._4_4_ = img_row._4_4_ + 1) {
    puVar3 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    puVar4 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,img_row._4_4_);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (lq = 0; lq < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
        lq = lq + 1) {
      if (puVar3[lq] == '\0') {
        puVar4[lq] = 0;
      }
      else {
        lr = 0;
        ls = 0;
        lx = 0;
        i_class = 0;
        if (0 < img_row._4_4_) {
          if (0 < lq) {
            lr = *(int *)((long)puVar4 + ((long)(lq + -1) * 4 - lVar2));
          }
          ls = *(int *)((long)puVar4 + ((long)lq * 4 - lVar2));
          if (lq < *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc +
                   -1) {
            lx = *(int *)((long)puVar4 + ((long)(lq + 1) * 4 - lVar2));
          }
        }
        if (0 < lq) {
          i_class = puVar4[lq + -1];
        }
        if ((((lr == 0) && (ls == 0)) && (lx == 0)) && (i_class == 0)) {
          k = this->i_new_label + 1;
          this->i_new_label = k;
          this->a_class[k] = k;
          this->a_single[k] = true;
        }
        else {
          k = lr;
          if (lr == 0) {
            k = ls;
          }
          if (k < 1) {
            k = lx;
          }
          else if ((0 < lx) && (this->a_class[k] != this->a_class[lx])) {
            if ((this->a_single[this->a_class[k]] & 1U) == 0) {
              if ((this->a_single[this->a_class[lx]] & 1U) == 0) {
                iVar1 = this->a_class[lx];
                for (k_1 = 1; k_1 <= this->i_new_label; k_1 = k_1 + 1) {
                  if (this->a_class[k_1] == iVar1) {
                    this->a_class[k_1] = this->a_class[k];
                  }
                }
              }
              else {
                this->a_class[lx] = this->a_class[k];
                this->a_single[this->a_class[k]] = false;
              }
            }
            else {
              this->a_class[k] = this->a_class[lx];
              this->a_single[this->a_class[lx]] = false;
            }
          }
          if (k < 1) {
            k = i_class;
          }
          else if ((0 < i_class) && (this->a_class[k] != this->a_class[i_class])) {
            if ((this->a_single[this->a_class[k]] & 1U) == 0) {
              if ((this->a_single[this->a_class[i_class]] & 1U) == 0) {
                iVar1 = this->a_class[i_class];
                for (local_58 = 1; local_58 <= this->i_new_label; local_58 = local_58 + 1) {
                  if (this->a_class[local_58] == iVar1) {
                    this->a_class[local_58] = this->a_class[k];
                  }
                }
              }
              else {
                this->a_class[i_class] = this->a_class[k];
                this->a_single[this->a_class[k]] = false;
              }
            }
            else {
              this->a_class[k] = this->a_class[i_class];
              this->a_single[this->a_class[i_class]] = false;
            }
          }
        }
        puVar4[lq] = k;
      }
    }
  }
  return;
}

Assistant:

void FirstScan()
    {
        i_new_label = 0;

        for (int y = 0; y < img_.rows; y++) {

            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int x = 0; x < img_.cols; x++) {
                if (img_row[x]) {

                    int lp(0), lq(0), lr(0), ls(0), lx(0); // lMin(INT_MAX);
                    if (y > 0) {
                        if (x > 0)
                            lp = img_labels_row_prev[x - 1];
                        lq = img_labels_row_prev[x];
                        if (x < img_.cols - 1)
                            lr = img_labels_row_prev[x + 1];
                    }
                    if (x > 0)
                        ls = img_labels_row[x - 1];

                    // If everything around is background
                    if (lp == 0 && lq == 0 && lr == 0 && ls == 0) {
                        lx = ++i_new_label;
                        a_class[lx] = lx;
                        a_single[lx] = true;
                    }
                    else {
                        // p
                        lx = lp;
                        // q
                        if (lx == 0)
                            lx = lq;
                        // r
                        if (lx > 0) {
                            if (lr > 0 && a_class[lx] != a_class[lr]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[lr];
                                    a_single[a_class[lr]] = false;
                                }
                                else if (a_single[a_class[lr]]) {
                                    a_class[lr] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[lr];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = lr;
                        // s
                        if (lx > 0) {
                            if (ls > 0 && a_class[lx] != a_class[ls]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[ls];
                                    a_single[a_class[ls]] = false;
                                }
                                else if (a_single[a_class[ls]]) {
                                    a_class[ls] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[ls];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = ls;
                    }

                    img_labels_row[x] = lx;
                }
                else
                    img_labels_row[x] = 0;
            }
        }
    }